

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_bool>
* __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::insert
          (InnerMap *this,KeyValuePair *kv)

{
  bool bVar1;
  KeyValuePair *in_RDX;
  long *in_RSI;
  InnerMap *in_RDI;
  iterator result;
  Node *node;
  size_type b;
  pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
  p;
  Node *in_stack_000000d0;
  size_type in_stack_000000d8;
  InnerMap *in_stack_000000e0;
  InnerMap *this_00;
  size_type in_stack_ffffffffffffffa0;
  InnerMap *in_stack_ffffffffffffffa8;
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::KeyValuePair>
  local_48 [24];
  pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
  local_30;
  KeyValuePair *local_10;
  
  this_00 = in_RDI;
  local_10 = in_RDX;
  KeyValuePair::key(in_RDX);
  FindHelper(this_00,(MapKey *)in_RDI);
  if (local_30.first.node_ == (Node *)0x0) {
    bVar1 = ResizeIfLoadIsOutOfRange(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    if (bVar1) {
      KeyValuePair::key(local_10);
      FindHelper(this_00,(MapKey *)in_RDI);
      std::
      pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
      ::operator=(&local_30,(type)&stack0xffffffffffffff90);
    }
    Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::
    Alloc<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::Node>
              (this_00,(size_type)in_RDI);
    Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::
    MapAllocator<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::KeyValuePair>
    ::
    construct<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::KeyValuePair,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::KeyValuePair_const&>
              ((MapAllocator<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                *)this_00,(KeyValuePair *)in_RDI,(KeyValuePair *)0x421a1d);
    InsertUnique(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
    *in_RSI = *in_RSI + 1;
    std::
    make_pair<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::iterator_base<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::KeyValuePair>&,bool>
              ((iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                *)this_00,(bool *)in_RDI);
  }
  else {
    Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::
    iterator_base<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::KeyValuePair>
    ::
    iterator_base<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::KeyValuePair_const>
              (local_48,&local_30.first);
    std::
    make_pair<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::iterator_base<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::KeyValuePair>,bool>
              ((iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                *)this_00,(bool *)in_RDI);
  }
  return (pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_bool>
          *)this_00;
}

Assistant:

std::pair<iterator, bool> insert(const KeyValuePair& kv) {
      std::pair<const_iterator, size_type> p = FindHelper(kv.key());
      // Case 1: key was already present.
      if (p.first.node_ != NULL)
        return std::make_pair(iterator(p.first), false);
      // Case 2: insert.
      if (ResizeIfLoadIsOutOfRange(num_elements_ + 1)) {
        p = FindHelper(kv.key());
      }
      const size_type b = p.second;  // bucket number
      Node* node = Alloc<Node>(1);
      alloc_.construct(&node->kv, kv);
      iterator result = InsertUnique(b, node);
      ++num_elements_;
      return std::make_pair(result, true);
    }